

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O0

bool __thiscall flow::lang::Lexer::ipv6HexPart(Lexer *this)

{
  bool bVar1;
  int iVar2;
  bool local_22;
  bool local_21;
  bool local_11;
  bool rv;
  Lexer *this_local;
  
  iVar2 = currentChar(this);
  if ((iVar2 == 0x3a) && (iVar2 = peekChar(this), iVar2 == 0x3a)) {
    std::__cxx11::string::operator=((string *)&this->stringValue_,"::");
    nextChar(this,true);
    nextChar(this,true);
    bVar1 = isHexChar(this);
    if (bVar1) {
      local_21 = ipv6HexSeq(this);
    }
    else {
      local_21 = true;
    }
    local_11 = local_21;
  }
  else {
    local_11 = ipv6HexSeq(this);
    if (((local_11) && (iVar2 = currentChar(this), iVar2 == 0x3a)) &&
       (iVar2 = peekChar(this), iVar2 == 0x3a)) {
      std::__cxx11::string::operator+=((string *)&this->stringValue_,"::");
      nextChar(this,true);
      nextChar(this,true);
      bVar1 = isHexChar(this);
      if (bVar1) {
        local_22 = ipv6HexSeq(this);
      }
      else {
        local_22 = true;
      }
      local_11 = local_22;
    }
  }
  iVar2 = isalnum(this->currentChar_);
  if ((iVar2 != 0) || (this->currentChar_ == 0x3a)) {
    local_11 = false;
  }
  return local_11;
}

Assistant:

bool Lexer::ipv6HexPart() {
  bool rv;

  if (currentChar() == ':' && peekChar() == ':') {  // (3)
    stringValue_ = "::";
    nextChar();  // skip ':'
    nextChar();  // skip ':'
    rv = isHexChar() ? ipv6HexSeq() : true;
  } else if (!!(rv = ipv6HexSeq())) {
    if (currentChar() == ':' && peekChar() == ':') {  // (2)
      stringValue_ += "::";
      nextChar();  // skip ':'
      nextChar();  // skip ':'
      rv = isHexChar() ? ipv6HexSeq() : true;
    }
  }

  if (std::isalnum(currentChar_) || currentChar_ == ':') rv = false;

  return rv;
}